

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionActivationEnvironment_createForDependentFunctionType
          (sysbvm_context_t *context,sysbvm_tuple_t parent,sysbvm_tuple_t dependentFunctionType)

{
  _Bool _Var1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  uint64_t value;
  ulong uVar4;
  
  if (dependentFunctionType != 0) {
    _Var1 = sysbvm_tuple_isKindOf
                      (context,dependentFunctionType,(context->roots).dependentFunctionTypeType);
    if (_Var1) goto LAB_001149f1;
  }
  sysbvm_error("Expected a dependent function type");
LAB_001149f1:
  psVar2 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionActivationEnvironmentType,0x13);
  psVar2[2].header.field_0.typePointer = parent;
  psVar2[5].field_1.pointers[0] = dependentFunctionType;
  value = 0;
  sVar3 = sysbvm_array_create(context,0);
  psVar2[6].header.identityHashAndFlags = (int)sVar3;
  psVar2[6].header.objectSize = (int)(sVar3 >> 0x20);
  uVar4 = *(ulong *)(dependentFunctionType + 0x128);
  if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
    value = (uint64_t)(*(uint *)(uVar4 + 0xc) >> 3);
  }
  uVar4 = *(ulong *)(dependentFunctionType + 0x130);
  if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 3);
  }
  else {
    uVar4 = 0;
  }
  sVar3 = sysbvm_tuple_uint64_encode(context,value);
  psVar2[6].header.field_0.typePointer = sVar3;
  sVar3 = sysbvm_array_create(context,uVar4 + value);
  psVar2[6].field_1.pointers[0] = sVar3;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionActivationEnvironment_createForDependentFunctionType(sysbvm_context_t *context, sysbvm_tuple_t parent, sysbvm_tuple_t dependentFunctionType)
{
    if(!dependentFunctionType || !sysbvm_tuple_isKindOf(context, dependentFunctionType, context->roots.dependentFunctionTypeType))
        sysbvm_error("Expected a dependent function type");

    sysbvm_dependentFunctionType_t *dependentFunctionTypeObject = (sysbvm_dependentFunctionType_t*)dependentFunctionType;
 
    sysbvm_functionActivationEnvironment_t *result = (sysbvm_functionActivationEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionActivationEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionActivationEnvironment_t));
    result->super.super.parent = parent;
    result->dependentFunctionType = dependentFunctionType;
    result->captureVector = sysbvm_array_create(context, 0);
    
    size_t argumentCount = sysbvm_array_getSize(dependentFunctionTypeObject->argumentBindings);
    size_t localCount = sysbvm_array_getSize(dependentFunctionTypeObject->localBindings);
    result->argumentVectorSize = sysbvm_tuple_size_encode(context, argumentCount);
    result->valueVector = sysbvm_array_create(context, argumentCount + localCount);
    return (sysbvm_tuple_t)result;
}